

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O1

void HACD::performUnitTests(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  MyHeapManager *this;
  void *pvVar5;
  int iVar6;
  NxU32 i_1;
  HeapManager *hm;
  NxU32 i;
  long lVar7;
  void *allocs [8192];
  undefined8 auStack_10028 [8192];
  
  memset(auStack_10028,0,0x10000);
  this = (MyHeapManager *)malloc(0x18);
  MyHeapManager::MyHeapManager(this,0x200000);
  hm = &this->super_HeapManager;
  srand(0);
  iVar6 = 40000000;
  do {
    uVar2 = rand();
    if ((void *)auStack_10028[uVar2 & 0x1fff] == (void *)0x0) {
      uVar3 = rand();
      uVar4 = rand();
      uVar1 = (uVar3 & 0x3f) + 0x100;
      if ((uVar4 & 0x7f) != 0) {
        uVar1 = uVar3 & 0x3f;
      }
      pvVar5 = heap_malloc(hm,(ulong)uVar1);
    }
    else {
      heap_free(hm,(void *)auStack_10028[uVar2 & 0x1fff]);
      pvVar5 = (void *)0x0;
    }
    auStack_10028[uVar2 & 0x1fff] = pvVar5;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  lVar7 = 0;
  do {
    if ((void *)auStack_10028[lVar7] != (void *)0x0) {
      heap_free(hm,(void *)auStack_10028[lVar7]);
      auStack_10028[lVar7] = 0;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x2000);
  printf("Micro allocation test took %d milliseconds.\r\n",0);
  srand(0);
  iVar6 = 40000000;
  do {
    uVar2 = rand();
    if ((void *)auStack_10028[uVar2 & 0x1fff] == (void *)0x0) {
      uVar3 = rand();
      uVar4 = rand();
      uVar1 = (uVar3 & 0x3f) + 0x100;
      if ((uVar4 & 0x7f) != 0) {
        uVar1 = uVar3 & 0x3f;
      }
      pvVar5 = malloc((ulong)uVar1);
    }
    else {
      free((void *)auStack_10028[uVar2 & 0x1fff]);
      pvVar5 = (void *)0x0;
    }
    auStack_10028[uVar2 & 0x1fff] = pvVar5;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  lVar7 = 0;
  do {
    if ((void *)auStack_10028[lVar7] != (void *)0x0) {
      free((void *)auStack_10028[lVar7]);
      auStack_10028[lVar7] = 0;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x2000);
  printf("Standard malloc/free test took %d milliseconds.\r\n",0);
  MyHeapManager::~MyHeapManager(this);
  free(this);
  return;
}

Assistant:

void performUnitTests(void)
{
    void *allocs[TEST_ALLOC_COUNT];
    for (NxU32 i=0; i<TEST_ALLOC_COUNT; i++)
    {
        allocs[i] = 0;
    }


    HeapManager *hm = createHeapManager(65536*32);


    {

      NxU32 stime = timeGetTime();
      srand(0);


      for (NxU32 i=0; i<TEST_RUN; i++)
      {
          NxU32 index = rand()&(TEST_ALLOC_COUNT-1);
          if ( allocs[index] )
          {
#if TEST_INLINE
              heap_free(hm, allocs[index] );
#else
              hm->heap_free( allocs[index] );
#endif
              allocs[index] = 0;
          }
          else
          {
              NxU32 asize = (rand()&TEST_SIZE);
			  if ( (rand()&127)==0) asize+=256; // one out of every 15 allocs is larger than 256 bytes.
#if TEST_INLINE
              allocs[index] = heap_malloc(hm,asize);
#else
              allocs[index] = hm->heap_malloc(asize);
#endif
          }
      }

      for (NxU32 i=0; i<TEST_ALLOC_COUNT; i++)
      {
          if ( allocs[i] )
          {
#if TEST_INLINE
              heap_free(hm,allocs[i] );
#else
              hm->heap_free(allocs[i] );
#endif
			  allocs[i] = 0;
          }
      }

      NxU32 etime = timeGetTime();
      printf("Micro allocation test took %d milliseconds.\r\n", etime - stime );

    }

    {

      NxU32 stime = timeGetTime();
      srand(0);


      for (NxU32 i=0; i<TEST_RUN; i++)
      {
          NxU32 index = rand()&(TEST_ALLOC_COUNT-1);
          if ( allocs[index] )
          {
              ::free( allocs[index] );
              allocs[index] = 0;
          }
          else
          {
              NxU32 asize = (rand()&TEST_SIZE);
			  if ( (rand()&127)==0) asize+=256; // one out of every 15 allocs is larger than 256 bytes.
              allocs[index] = ::malloc(asize);
          }
      }

      for (NxU32 i=0; i<TEST_ALLOC_COUNT; i++)
      {
          if ( allocs[i] )
          {
              ::free(allocs[i] );
			  allocs[i] = 0;
          }
      }

      NxU32 etime = timeGetTime();
      printf("Standard malloc/free test took %d milliseconds.\r\n", etime - stime );

    }

    releaseHeapManager(hm);
}